

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O1

int mbedtls_x509_crl_parse_der(mbedtls_x509_crl *chain,uchar *buf,size_t buflen)

{
  int *val;
  size_t __n;
  int iVar1;
  int iVar2;
  mbedtls_x509_crl *__s;
  uchar *puVar3;
  mbedtls_x509_crl *crl;
  uchar *p;
  size_t len;
  mbedtls_x509_buf sig_params1;
  mbedtls_x509_buf sig_oid2;
  mbedtls_x509_buf sig_params2;
  uchar *local_98;
  size_t local_90;
  mbedtls_x509_buf local_88;
  mbedtls_x509_buf local_68;
  mbedtls_x509_buf local_48;
  
  local_98 = (uchar *)0x0;
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crl *)0x0) {
    return -0x2800;
  }
  local_88.tag = 0;
  local_88._4_4_ = 0;
  local_88.len = 0;
  local_88.p = (uchar *)0x0;
  local_48.tag = 0;
  local_48._4_4_ = 0;
  local_48.len = 0;
  local_48.p = (uchar *)0x0;
  local_68.tag = 0;
  local_68._4_4_ = 0;
  local_68.len = 0;
  local_68.p = (uchar *)0x0;
  do {
    crl = chain;
    if (crl->version == 0) goto LAB_0010c50b;
    chain = crl->next;
  } while (crl->next != (mbedtls_x509_crl *)0x0);
  if ((crl->version != 0) && (crl->next == (mbedtls_x509_crl *)0x0)) {
    __s = (mbedtls_x509_crl *)calloc(1,0x1a0);
    crl->next = __s;
    if (__s == (mbedtls_x509_crl *)0x0) {
      mbedtls_x509_crl_free(crl);
      return -0x2880;
    }
    memset(__s,0,0x1a0);
    crl = crl->next;
  }
LAB_0010c50b:
  iVar2 = -0x2180;
  if (buflen == 0) {
    return -0x2180;
  }
  puVar3 = (uchar *)calloc(1,buflen);
  if (puVar3 == (uchar *)0x0) {
    return -0x2880;
  }
  local_98 = puVar3;
  memcpy(puVar3,buf,buflen);
  (crl->raw).p = puVar3;
  (crl->raw).len = buflen;
  puVar3 = puVar3 + buflen;
  iVar1 = mbedtls_asn1_get_tag(&local_98,puVar3,&local_90,0x30);
  if (iVar1 != 0) goto LAB_0010c568;
  if (local_90 != (long)puVar3 - (long)local_98) goto LAB_0010c755;
  (crl->tbs).p = local_98;
  iVar2 = mbedtls_asn1_get_tag(&local_98,puVar3,&local_90,0x30);
  if (iVar2 != 0) {
LAB_0010c5a7:
    mbedtls_x509_crl_free(crl);
    return iVar2 + -0x2180;
  }
  puVar3 = local_98 + local_90;
  (crl->tbs).len = (long)puVar3 - (long)(crl->tbs).p;
  val = &crl->version;
  iVar2 = mbedtls_asn1_get_int(&local_98,puVar3,val);
  if (iVar2 != 0) {
    if (iVar2 == -0x62) {
      *val = 0;
      iVar2 = 0;
    }
    else {
      iVar2 = iVar2 + -0x2200;
    }
  }
  if (iVar2 == 0) {
    iVar2 = mbedtls_x509_get_alg(&local_98,puVar3,&crl->sig_oid,&local_88);
    if (iVar2 == 0) {
      if (1 < (uint)*val) {
        mbedtls_x509_crl_free(crl);
        return -0x2580;
      }
      crl->version = *val + 1;
      iVar2 = mbedtls_x509_get_sig_alg
                        (&crl->sig_oid,&local_88,&crl->sig_md,&crl->sig_pk,&crl->sig_opts);
      if (iVar2 != 0) {
        mbedtls_x509_crl_free(crl);
        return -0x2600;
      }
      (crl->issuer_raw).p = local_98;
      iVar2 = mbedtls_asn1_get_tag(&local_98,puVar3,&local_90,0x30);
      if (iVar2 != 0) goto LAB_0010c5a7;
      iVar2 = mbedtls_x509_get_name(&local_98,local_98 + local_90,&crl->issuer);
      if (iVar2 == 0) {
        (crl->issuer_raw).len = (long)local_98 - (long)(crl->issuer_raw).p;
        iVar2 = mbedtls_x509_get_time(&local_98,puVar3,&crl->this_update);
        if (((iVar2 == 0) &&
            ((((iVar2 = mbedtls_x509_get_time(&local_98,puVar3,&crl->next_update), iVar2 == -0x2462
               || (iVar2 == -0x2460)) || (iVar2 == 0)) &&
             (iVar2 = x509_get_entries(&local_98,puVar3,&crl->entry), iVar2 == 0)))) &&
           ((*val != 2 || (iVar2 = x509_get_crl_ext(&local_98,puVar3,&crl->crl_ext), iVar2 == 0))))
        {
          if (local_98 != puVar3) {
LAB_0010c755:
            mbedtls_x509_crl_free(crl);
            return -0x21e6;
          }
          puVar3 = (crl->raw).p + (crl->raw).len;
          iVar2 = mbedtls_x509_get_alg(&local_98,puVar3,&local_68,&local_48);
          if (iVar2 == 0) {
            __n = (crl->sig_oid).len;
            if (((__n != local_68.len) ||
                (iVar2 = bcmp((crl->sig_oid).p,local_68.p,__n), iVar2 != 0)) ||
               ((local_88.len != local_48.len ||
                ((local_88.len != 0 &&
                 (iVar2 = bcmp(local_88.p,local_48.p,local_88.len), iVar2 != 0)))))) {
              mbedtls_x509_crl_free(crl);
              return -0x2680;
            }
            iVar2 = mbedtls_x509_get_sig(&local_98,puVar3,&crl->sig);
            if (iVar2 == 0) {
              if (local_98 == puVar3) {
                return 0;
              }
              goto LAB_0010c755;
            }
          }
        }
      }
    }
  }
LAB_0010c568:
  mbedtls_x509_crl_free(crl);
  return iVar2;
}

Assistant:

int mbedtls_x509_crl_parse_der( mbedtls_x509_crl *chain,
                        const unsigned char *buf, size_t buflen )
{
    int ret;
    size_t len;
    unsigned char *p = NULL, *end = NULL;
    mbedtls_x509_buf sig_params1, sig_params2, sig_oid2;
    mbedtls_x509_crl *crl = chain;

    /*
     * Check for valid input
     */
    if( crl == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    memset( &sig_params1, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_params2, 0, sizeof( mbedtls_x509_buf ) );
    memset( &sig_oid2, 0, sizeof( mbedtls_x509_buf ) );

    /*
     * Add new CRL on the end of the chain if needed.
     */
    while( crl->version != 0 && crl->next != NULL )
        crl = crl->next;

    if( crl->version != 0 && crl->next == NULL )
    {
        crl->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crl ) );

        if( crl->next == NULL )
        {
            mbedtls_x509_crl_free( crl );
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );
        }

        mbedtls_x509_crl_init( crl->next );
        crl = crl->next;
    }

    /*
     * Copy raw DER-encoded CRL
     */
    if( buflen == 0 )
        return( MBEDTLS_ERR_X509_INVALID_FORMAT );

    p = mbedtls_calloc( 1, buflen );
    if( p == NULL )
        return( MBEDTLS_ERR_X509_ALLOC_FAILED );

    memcpy( p, buf, buflen );

    crl->raw.p = p;
    crl->raw.len = buflen;

    end = p + buflen;

    /*
     * CertificateList  ::=  SEQUENCE  {
     *      tbsCertList          TBSCertList,
     *      signatureAlgorithm   AlgorithmIdentifier,
     *      signatureValue       BIT STRING  }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT );
    }

    if( len != (size_t) ( end - p ) )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    /*
     * TBSCertList  ::=  SEQUENCE  {
     */
    crl->tbs.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    end = p + len;
    crl->tbs.len = end - crl->tbs.p;

    /*
     * Version  ::=  INTEGER  OPTIONAL {  v1(0), v2(1)  }
     *               -- if present, MUST be v2
     *
     * signature            AlgorithmIdentifier
     */
    if( ( ret = x509_crl_get_version( &p, end, &crl->version ) ) != 0 ||
        ( ret = mbedtls_x509_get_alg( &p, end, &crl->sig_oid, &sig_params1 ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( crl->version < 0 || crl->version > 1 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_UNKNOWN_VERSION );
    }

    crl->version++;

    if( ( ret = mbedtls_x509_get_sig_alg( &crl->sig_oid, &sig_params1,
                                  &crl->sig_md, &crl->sig_pk,
                                  &crl->sig_opts ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_UNKNOWN_SIG_ALG );
    }

    /*
     * issuer               Name
     */
    crl->issuer_raw.p = p;

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT + ret );
    }

    if( ( ret = mbedtls_x509_get_name( &p, p + len, &crl->issuer ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    crl->issuer_raw.len = p - crl->issuer_raw.p;

    /*
     * thisUpdate          Time
     * nextUpdate          Time OPTIONAL
     */
    if( ( ret = mbedtls_x509_get_time( &p, end, &crl->this_update ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( ( ret = mbedtls_x509_get_time( &p, end, &crl->next_update ) ) != 0 )
    {
        if( ret != ( MBEDTLS_ERR_X509_INVALID_DATE +
                        MBEDTLS_ERR_ASN1_UNEXPECTED_TAG ) &&
            ret != ( MBEDTLS_ERR_X509_INVALID_DATE +
                        MBEDTLS_ERR_ASN1_OUT_OF_DATA ) )
        {
            mbedtls_x509_crl_free( crl );
            return( ret );
        }
    }

    /*
     * revokedCertificates    SEQUENCE OF SEQUENCE   {
     *      userCertificate        CertificateSerialNumber,
     *      revocationDate         Time,
     *      crlEntryExtensions     Extensions OPTIONAL
     *                                   -- if present, MUST be v2
     *                        } OPTIONAL
     */
    if( ( ret = x509_get_entries( &p, end, &crl->entry ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    /*
     * crlExtensions          EXPLICIT Extensions OPTIONAL
     *                              -- if present, MUST be v2
     */
    if( crl->version == 2 )
    {
        ret = x509_get_crl_ext( &p, end, &crl->crl_ext );

        if( ret != 0 )
        {
            mbedtls_x509_crl_free( crl );
            return( ret );
        }
    }

    if( p != end )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    end = crl->raw.p + crl->raw.len;

    /*
     *  signatureAlgorithm   AlgorithmIdentifier,
     *  signatureValue       BIT STRING
     */
    if( ( ret = mbedtls_x509_get_alg( &p, end, &sig_oid2, &sig_params2 ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( crl->sig_oid.len != sig_oid2.len ||
        memcmp( crl->sig_oid.p, sig_oid2.p, crl->sig_oid.len ) != 0 ||
        sig_params1.len != sig_params2.len ||
        ( sig_params1.len != 0 &&
          memcmp( sig_params1.p, sig_params2.p, sig_params1.len ) != 0 ) )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_SIG_MISMATCH );
    }

    if( ( ret = mbedtls_x509_get_sig( &p, end, &crl->sig ) ) != 0 )
    {
        mbedtls_x509_crl_free( crl );
        return( ret );
    }

    if( p != end )
    {
        mbedtls_x509_crl_free( crl );
        return( MBEDTLS_ERR_X509_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }

    return( 0 );
}